

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxerManager.cpp
# Opt level: O1

void __thiscall MuxerManager::asyncWriteBlock(MuxerManager *this,WriterData *data)

{
  int iVar1;
  size_type sVar2;
  
  sVar2 = SafeQueue<WriterData>::size((SafeQueue<WriterData> *)&this->m_fileWriter->m_writeQueue);
  iVar1 = (int)sVar2;
  while (0x80 < iVar1) {
    Process::sleep(1);
    sVar2 = SafeQueue<WriterData>::size((SafeQueue<WriterData> *)&this->m_fileWriter->m_writeQueue);
    iVar1 = (int)sVar2;
  }
  BufferedFileWriter::addWriterData(this->m_fileWriter,data);
  return;
}

Assistant:

void MuxerManager::asyncWriteBlock(const WriterData& data) const
{
    static constexpr int nMaxWriteQueueSize = 256 * 1024 * 1024 / DEFAULT_FILE_BLOCK_SIZE;
    while (m_fileWriter->getQueueSize() > nMaxWriteQueueSize)
    {
        Process::sleep(1);
    }
    m_fileWriter->addWriterData(data);
}